

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::CheckerVisitor::checkCanReturnNull(CheckerVisitor *this,BinExpr *bin)

{
  bool bVar1;
  TreeOp TVar2;
  CallExpr *this_00;
  CallExpr *this_01;
  Node *this_02;
  FunctionInfo *pFVar3;
  Id *this_03;
  GetFieldExpr *this_04;
  BinExpr *in_RSI;
  CheckerVisitor *in_RDI;
  SQChar *funcName;
  FunctionInfo *info;
  bool isCtor;
  Expr *callee;
  CallExpr *c;
  Expr *r;
  Expr *l;
  bool *in_stack_000000a8;
  Expr *in_stack_000000b0;
  CheckerVisitor *in_stack_000000b8;
  Expr *in_stack_ffffffffffffffa8;
  SQChar *local_48;
  CallExpr *local_28;
  
  if ((in_RDI->effectsOnly & 1U) == 0) {
    TVar2 = Node::op((Node *)in_RSI);
    bVar1 = isPureArithOperator(TVar2);
    if (!bVar1) {
      TVar2 = Node::op((Node *)in_RSI);
      bVar1 = isRelationOperator(TVar2);
      if (!bVar1) {
        return;
      }
    }
    BinExpr::lhs(in_RSI);
    skipUnary(in_stack_ffffffffffffffa8);
    maybeEval(in_RDI,in_stack_ffffffffffffffa8,false);
    this_00 = (CallExpr *)skipUnary(in_stack_ffffffffffffffa8);
    BinExpr::rhs(in_RSI);
    skipUnary(in_stack_ffffffffffffffa8);
    maybeEval(in_RDI,in_stack_ffffffffffffffa8,false);
    this_01 = (CallExpr *)skipUnary(in_stack_ffffffffffffffa8);
    local_28 = (CallExpr *)0x0;
    TVar2 = Node::op((Node *)this_00);
    if ((TVar2 != TO_CALL) &&
       (TVar2 = Node::op((Node *)this_01), this_00 = local_28, TVar2 == TO_CALL)) {
      this_00 = this_01;
    }
    local_28 = this_00;
    if (local_28 != (CallExpr *)0x0) {
      this_02 = &CallExpr::callee(local_28)->super_Node;
      pFVar3 = findFunctionInfo(in_stack_000000b8,in_stack_000000b0,in_stack_000000a8);
      local_48 = (SQChar *)0x0;
      if (pFVar3 == (FunctionInfo *)0x0) {
        TVar2 = Node::op(this_02);
        if (TVar2 == TO_ID) {
          this_03 = Node::asId(this_02);
          local_48 = Id::id(this_03);
        }
        else {
          TVar2 = Node::op(this_02);
          if (TVar2 == TO_GETFIELD) {
            this_04 = Node::asGetField(this_02);
            local_48 = FieldAccessExpr::fieldName(&this_04->super_FieldAccessExpr);
          }
        }
      }
      else {
        local_48 = FunctionDecl::name(pFVar3->declaration);
      }
      if ((local_48 != (SQChar *)0x0) && (bVar1 = canFunctionReturnNull((SQChar *)0x18b220), bVar1))
      {
        report(in_RDI,(Node *)local_28,0x5e,local_48);
      }
    }
  }
  return;
}

Assistant:

void CheckerVisitor::checkCanReturnNull(const BinExpr *bin) {
  if (effectsOnly)
    return;


  if (!isPureArithOperator(bin->op()) && !isRelationOperator(bin->op())) {
    return;
  }

  const Expr *l = skipUnary(maybeEval(skipUnary(bin->lhs())));
  const Expr *r = skipUnary(maybeEval(skipUnary(bin->rhs())));
  const CallExpr *c = nullptr;

  if (l->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(l);
  else if (r->op() == TO_CALL) // -V522
    c = static_cast<const CallExpr *>(r);

  if (!c)
    return;

  const Expr *callee = c->callee();
  bool isCtor = false;
  const FunctionInfo *info = findFunctionInfo(callee, isCtor);

  if (isCtor)
    return;

  const SQChar *funcName = nullptr;

  if (info) {
    funcName = info->declaration->name();
  }
  else if (callee->op() == TO_ID) {
    funcName = callee->asId()->id();
  }
  else if (callee->op() == TO_GETFIELD) {
    funcName = callee->asGetField()->fieldName();
  }

  if (funcName) {
    if (canFunctionReturnNull(funcName)) {
      report(c, DiagnosticsId::DI_FUNC_CAN_RET_NULL, funcName);
    }
  }
}